

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateModuleGlobalFunctionInformation(ExpressionTranslateContext *ctx)

{
  FunctionData *function;
  ScopeData *pSVar1;
  ModuleData *pMVar2;
  char *pcVar3;
  bool bVar4;
  FunctionData **ppFVar5;
  uint i;
  uint index;
  char *pcVar6;
  
  PrintIndentedLine(ctx,"// Register functions");
  for (index = 0; index < (ctx->ctx->functions).count; index = index + 1) {
    ppFVar5 = SmallArray<FunctionData_*,_128U>::operator[](&ctx->ctx->functions,index);
    function = *ppFVar5;
    bVar4 = ExpressionContext::IsGenericFunction(ctx->ctx,function);
    if (bVar4) {
      PrintIndentedLine(ctx,"__nullcFR[%d] = 0; // generic function \'%.*s\'",(ulong)index,
                        (ulong)(uint)(*(int *)&(function->name->name).end -
                                     (int)(function->name->name).begin));
    }
    else {
      pSVar1 = function->scope;
      if (((((pSVar1 == ctx->ctx->globalScope) || (pSVar1->ownerNamespace != (NamespaceData *)0x0))
           || (pSVar1->ownerType != (TypeBase *)0x0)) &&
          ((*(function->name->name).begin != '$' && (function->isHidden != true)))) ||
         (pMVar2 = function->importModule, pMVar2 == (ModuleData *)0x0)) {
        PrintIndent(ctx);
        Print(ctx,"__nullcFR[%d] = __nullcRegisterFunction(\"",(ulong)index);
        TranslateFunctionName(ctx,function);
        Print(ctx,"\", (void*)");
        TranslateFunctionName(ctx,function);
        bVar4 = UseNonStaticTemplate(ctx,function);
        if (bVar4) {
          Print(ctx,"<0>");
        }
        if (function->contextType == (TypeBase *)0x0) {
          Print(ctx,", -1");
        }
        else {
          Print(ctx,", __nullcTR[%d]",(ulong)function->contextType->typeIndex);
        }
        pcVar6 = ", FunctionCategory::THISCALL";
        if (((function->scope->ownerType == (TypeBase *)0x0) &&
            (pcVar6 = ", FunctionCategory::COROUTINE", function->coroutine == false)) &&
           (pcVar6 = ", FunctionCategory::LOCAL",
           (TypeRef *)function->contextType == ctx->ctx->typeVoid->refType)) {
          pcVar6 = ", FunctionCategory::NORMAL";
        }
        Print(ctx,pcVar6);
        pcVar6 = ", false);";
        if (*(function->name->name).begin == '$') {
          pcVar6 = ", true);";
        }
        Print(ctx,pcVar6);
        PrintLine(ctx);
      }
      else {
        pcVar6 = (pMVar2->name).begin;
        pcVar3 = (function->name->name).begin;
        PrintIndentedLine(ctx,"__nullcFR[%d] = 0; // module \'%.*s\' internal function \'%.*s\'",
                          (ulong)index,(ulong)(uint)(*(int *)&(pMVar2->name).end - (int)pcVar6),
                          pcVar6,(ulong)(uint)(*(int *)&(function->name->name).end - (int)pcVar3),
                          pcVar3);
      }
    }
  }
  PrintLine(ctx);
  return;
}

Assistant:

void TranslateModuleGlobalFunctionInformation(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Register functions");

	for(unsigned i = 0; i < ctx.ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.ctx.functions[i];

		if(ctx.ctx.IsGenericFunction(function))
		{
			PrintIndentedLine(ctx, "__nullcFR[%d] = 0; // generic function '%.*s'", i, FMT_ISTR(function->name->name));
			continue;
		}

		bool isStatic = false;

		if(function->scope != ctx.ctx.globalScope && !function->scope->ownerNamespace && !function->scope->ownerType)
			isStatic = true;
		else if(*function->name->name.begin == '$')
			isStatic = true;
		else if(function->isHidden)
			isStatic = true;

		if(isStatic && function->importModule)
		{
			PrintIndentedLine(ctx, "__nullcFR[%d] = 0; // module '%.*s' internal function '%.*s'", i, FMT_ISTR(function->importModule->name), FMT_ISTR(function->name->name));
			continue;
		}

		PrintIndent(ctx);
		Print(ctx, "__nullcFR[%d] = __nullcRegisterFunction(\"", i);
		TranslateFunctionName(ctx, function);
		Print(ctx, "\", (void*)");
		TranslateFunctionName(ctx, function);

		if(UseNonStaticTemplate(ctx, function))
			Print(ctx, "<0>");

		if(function->contextType)
			Print(ctx, ", __nullcTR[%d]", function->contextType->typeIndex);
		else
			Print(ctx, ", -1");

		if(function->scope->ownerType)
			Print(ctx, ", FunctionCategory::THISCALL");
		else if(function->coroutine)
			Print(ctx, ", FunctionCategory::COROUTINE");
		else if(function->contextType != ctx.ctx.typeVoid->refType)
			Print(ctx, ", FunctionCategory::LOCAL");
		else
			Print(ctx, ", FunctionCategory::NORMAL");

		if(*function->name->name.begin == '$')
			Print(ctx, ", true);");
		else
			Print(ctx, ", false);");

		PrintLine(ctx);
	}

	PrintLine(ctx);
}